

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
TransferList(InnerMap *this,void **table,size_type index)

{
  long in_RDX;
  long in_RSI;
  Node *next;
  Node *node;
  Node *in_stack_00000140;
  size_type in_stack_00000148;
  InnerMap *in_stack_00000150;
  MapKey *in_stack_ffffffffffffffc8;
  InnerMap *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  
  local_20 = *(long *)(in_RSI + in_RDX * 8);
  do {
    local_20 = *(long *)(local_20 + 0x18);
    KeyPtrFromNodePtr((Node *)0x422457);
    BucketNumber(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    InsertUnique(in_stack_00000150,in_stack_00000148,in_stack_00000140);
  } while (local_20 != 0);
  return;
}

Assistant:

void TransferList(void* const* table, size_type index) {
      Node* node = static_cast<Node*>(table[index]);
      do {
        Node* next = node->next;
        InsertUnique(BucketNumber(*KeyPtrFromNodePtr(node)), node);
        node = next;
      } while (node != NULL);
    }